

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettyprint.hh
# Opt level: O1

void __thiscall
TokenSplit::tagVariable(TokenSplit *this,char *ptr,syntax_highlight h,Varnode *v,PcodeOp *o)

{
  char *pcVar1;
  
  pcVar1 = (char *)(this->tok)._M_string_length;
  strlen(ptr);
  std::__cxx11::string::_M_replace((ulong)&this->tok,0,pcVar1,(ulong)ptr);
  this->size = (int4)(this->tok)._M_string_length;
  this->tagtype = vari_t;
  this->delimtype = tokenstring;
  this->hl = h;
  (this->ptr_second).vn = v;
  this->op = o;
  return;
}

Assistant:

void tagVariable(const char *ptr,EmitXml::syntax_highlight h,
		    const Varnode *v,const PcodeOp *o) {
    tok = ptr; size = tok.size();
    tagtype=vari_t; delimtype=tokenstring; hl=h; ptr_second.vn=v; op=o; }